

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::TokenizeGNUCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  bool bVar1;
  char cVar2;
  bool local_151;
  char *local_150;
  StringRef local_148;
  StringRef local_138;
  char *local_128;
  StringRef local_120;
  StringRef local_110;
  char *local_100;
  char local_f3;
  char local_f2;
  char local_f1;
  char *pcStack_f0;
  char C;
  char *local_e8;
  size_t E;
  size_t I;
  SmallString<128U> Token;
  bool MarkEOLs_local;
  SmallVectorImpl<const_char_*> *NewArgv_local;
  StringSaver *Saver_local;
  StringRef Src_local;
  
  Src_local.Data = Src.Data;
  Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts[0x7f].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)((byte)NewArgv & 1);
  Saver_local = (StringSaver *)this;
  SmallString<128U>::SmallString((SmallString<128U> *)&I);
  Src_local.Length = (size_t)&Saver_local;
  local_e8 = Src_local.Data;
  for (E = 0; (char *)E != local_e8; E = E + 1) {
    bVar1 = SmallVectorBase::empty((SmallVectorBase *)&I);
    if (bVar1) {
      while( true ) {
        local_151 = false;
        if ((char *)E != local_e8) {
          cVar2 = StringRef::operator[]((StringRef *)&Saver_local,E);
          local_151 = isWhitespace(cVar2);
        }
        if (local_151 == false) break;
        if ((((byte)Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                    InlineElts[0x7f].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1) != 0) &&
           (cVar2 = StringRef::operator[]((StringRef *)&Saver_local,E), cVar2 == '\n')) {
          pcStack_f0 = (char *)0x0;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&stack0xffffffffffffff10);
        }
        E = E + 1;
      }
      if ((char *)E == local_e8) break;
    }
    local_f1 = StringRef::operator[]((StringRef *)&Saver_local,E);
    if (((char *)(E + 1) < local_e8) && (local_f1 == '\\')) {
      E = E + 1;
      local_f2 = StringRef::operator[]((StringRef *)&Saver_local,E);
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)&I,&local_f2);
    }
    else {
      bVar1 = isQuote(local_f1);
      if (bVar1) {
        while( true ) {
          E = E + 1;
          bVar1 = false;
          if ((char *)E != local_e8) {
            cVar2 = StringRef::operator[]((StringRef *)&Saver_local,E);
            bVar1 = cVar2 != local_f1;
          }
          if (!bVar1) break;
          cVar2 = StringRef::operator[]((StringRef *)&Saver_local,E);
          if ((cVar2 == '\\') && ((char *)(E + 1) != local_e8)) {
            E = E + 1;
          }
          local_f3 = StringRef::operator[]((StringRef *)&Saver_local,E);
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)&I,&local_f3);
        }
        if ((char *)E == local_e8) break;
      }
      else {
        bVar1 = isWhitespace(local_f1);
        if (bVar1) {
          bVar1 = SmallVectorBase::empty((SmallVectorBase *)&I);
          if (!bVar1) {
            local_120 = SmallString::operator_cast_to_StringRef((SmallString *)&I);
            local_110 = StringSaver::save((StringSaver *)Src.Length,local_120);
            local_100 = local_110.Data;
            SmallVectorTemplateBase<const_char_*,_true>::push_back
                      ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_100);
          }
          SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)&I);
        }
        else {
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)&I,&local_f1);
        }
      }
    }
  }
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)&I);
  if (!bVar1) {
    local_148 = SmallString::operator_cast_to_StringRef((SmallString *)&I);
    local_138 = StringSaver::save((StringSaver *)Src.Length,local_148);
    local_128 = local_138.Data;
    SmallVectorTemplateBase<const_char_*,_true>::push_back
              ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_128);
  }
  if (((byte)Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts
             [0x7f].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1) != 0) {
    local_150 = (char *)0x0;
    SmallVectorTemplateBase<const_char_*,_true>::push_back
              ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_150);
  }
  SmallString<128U>::~SmallString((SmallString<128U> *)&I);
  return;
}

Assistant:

void cl::TokenizeGNUCommandLine(StringRef Src, StringSaver &Saver,
                                SmallVectorImpl<const char *> &NewArgv,
                                bool MarkEOLs) {
  SmallString<128> Token;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    // Consume runs of whitespace.
    if (Token.empty()) {
      while (I != E && isWhitespace(Src[I])) {
        // Mark the end of lines in response files
        if (MarkEOLs && Src[I] == '\n')
          NewArgv.push_back(nullptr);
        ++I;
      }
      if (I == E)
        break;
    }

    char C = Src[I];

    // Backslash escapes the next character.
    if (I + 1 < E && C == '\\') {
      ++I; // Skip the escape.
      Token.push_back(Src[I]);
      continue;
    }

    // Consume a quoted string.
    if (isQuote(C)) {
      ++I;
      while (I != E && Src[I] != C) {
        // Backslash escapes the next character.
        if (Src[I] == '\\' && I + 1 != E)
          ++I;
        Token.push_back(Src[I]);
        ++I;
      }
      if (I == E)
        break;
      continue;
    }

    // End the token if this is whitespace.
    if (isWhitespace(C)) {
      if (!Token.empty())
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
      Token.clear();
      continue;
    }

    // This is a normal character.  Append it.
    Token.push_back(C);
  }

  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}